

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O2

void __thiscall QCborStreamWriter::startMap(QCborStreamWriter *this,quint64 count)

{
  QCborStreamWriterPrivate::createContainer
            ((this->d)._M_t.
             super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
             .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl,
             cbor_encoder_create_map,count);
  return;
}

Assistant:

void QCborStreamWriter::startMap(quint64 count)
{
    d->createContainer(cbor_encoder_create_map, count);
}